

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::~crn_comp(crn_comp *this)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *local_c8;
  vector<unsigned_short> *local_b0;
  symbol_histogram *local_98;
  static_huffman_data_model *local_80;
  vector<unsigned_short> *local_68;
  symbol_histogram *local_50;
  static_huffman_data_model *local_38;
  vector<unsigned_char> *local_18;
  crn_comp *this_local;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__crn_comp_00259858;
  vector<unsigned_char>::~vector(&this->m_packed_alpha_selectors);
  vector<unsigned_char>::~vector(&this->m_packed_alpha_endpoints);
  vector<unsigned_char>::~vector(&this->m_packed_color_selectors);
  vector<unsigned_char>::~vector(&this->m_packed_color_endpoints);
  vector<unsigned_char>::~vector(&this->m_packed_data_models);
  local_18 = &this->m_packed_data_models;
  do {
    local_18 = local_18 + -1;
    vector<unsigned_char>::~vector(local_18);
  } while (local_18 != this->m_packed_blocks);
  local_38 = (static_huffman_data_model *)this->m_packed_blocks;
  do {
    local_38 = local_38 + -1;
    static_huffman_data_model::~static_huffman_data_model(local_38);
  } while (local_38 != (static_huffman_data_model *)&this->field_0x2740);
  local_50 = (symbol_histogram *)&this->field_0x2740;
  do {
    local_50 = local_50 + -1;
    symbol_histogram::~symbol_histogram(local_50);
  } while (local_50 != this->m_selector_index_hist);
  local_68 = (vector<unsigned_short> *)this->m_selector_index_hist;
  do {
    local_68 = local_68 + -1;
    vector<unsigned_short>::~vector(local_68);
  } while (local_68 != this->m_selector_remaping);
  local_80 = (static_huffman_data_model *)this->m_selector_remaping;
  do {
    local_80 = local_80 + -1;
    static_huffman_data_model::~static_huffman_data_model(local_80);
  } while (local_80 != (static_huffman_data_model *)&this->field_0x2690);
  local_98 = (symbol_histogram *)&this->field_0x2690;
  do {
    local_98 = local_98 + -1;
    symbol_histogram::~symbol_histogram(local_98);
  } while (local_98 != this->m_endpoint_index_hist);
  local_b0 = (vector<unsigned_short> *)this->m_endpoint_index_hist;
  do {
    local_b0 = local_b0 + -1;
    vector<unsigned_short>::~vector(local_b0);
  } while (local_b0 != this->m_endpoint_remaping);
  static_huffman_data_model::~static_huffman_data_model(&this->m_reference_dm);
  symbol_histogram::~symbol_histogram(&this->m_reference_hist);
  dxt_hc::~dxt_hc(&this->m_hvq);
  vector<unsigned_char>::~vector(&this->m_comp_data);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector(&this->m_selector_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector(&this->m_endpoint_indices);
  vector<unsigned_long_long>::~vector(&this->m_alpha_selectors);
  vector<unsigned_int>::~vector(&this->m_color_selectors);
  vector<unsigned_int>::~vector(&this->m_alpha_endpoints);
  vector<unsigned_int>::~vector(&this->m_color_endpoints);
  vector<crnlib::crn_comp::level_details>::~vector(&this->m_levels);
  local_c8 = (image<crnlib::color_quad<unsigned_char,_int>_> *)this->m_has_comp;
  do {
    local_c8 = local_c8 + -1;
    image<crnlib::color_quad<unsigned_char,_int>_>::~image(local_c8);
  } while (local_c8 != this->m_images[0]);
  task_pool::~task_pool(&this->m_task_pool);
  itexture_comp::~itexture_comp(&this->super_itexture_comp);
  return;
}

Assistant:

crn_comp::~crn_comp() {
}